

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O2

float __thiscall
rlottie::internal::model::KeyFrames<float,_void>::Frame::value(Frame *this,int frameNo)

{
  float fVar1;
  float fVar2;
  
  fVar2 = progress(this,frameNo);
  fVar1 = (this->value_).start_;
  return fVar2 * ((this->value_).end_ - fVar1) + fVar1;
}

Assistant:

T     value(int frameNo) const { return value_.at(progress(frameNo)); }